

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar16;
  ushort uVar17;
  uint uVar18;
  Geometry *pGVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  RTCRayQueryContext *pRVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  RayHit *pRVar43;
  byte bVar44;
  byte bVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  uint uVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  RTCIntersectArguments *pRVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  float fVar59;
  float fVar94;
  float fVar95;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar96;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined4 uVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  undefined1 auVar109 [16];
  float fVar111;
  undefined1 auVar110 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined8 uVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 in_ZMM27 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vint8 bi;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27d9;
  ulong *local_27d8;
  RTCIntersectArguments *local_27d0;
  long local_27c8;
  RTCRayQueryContext *local_27c0;
  long local_27b8;
  ulong local_27b0;
  uint local_27a4;
  uint local_27a0;
  int local_279c;
  ulong local_2798;
  ulong local_2790;
  long local_2788;
  long local_2780;
  long local_2778;
  long local_2770;
  long local_2768;
  long local_2760;
  long local_2758;
  long local_2750;
  ulong local_2748;
  RayHit *local_2740;
  RayQueryContext *local_2738;
  long local_2730;
  long local_2728;
  Scene *local_2720;
  ulong local_2718;
  RTCFilterFunctionNArguments local_2710;
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float local_26b0;
  float local_26ac;
  float local_26a8;
  undefined4 local_26a4;
  undefined4 local_26a0;
  undefined4 local_269c;
  undefined4 local_2698;
  uint local_2694;
  uint local_2690;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined1 local_25c0 [8];
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  undefined1 local_25a0 [8];
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 local_2560;
  undefined4 uStack_255c;
  undefined4 uStack_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined1 local_2520 [32];
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 *local_24c0;
  uint local_24b8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440 [4];
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  uint uStack_2424;
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar65 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      aVar8 = (ray->super_RayK<1>).dir.field_0;
      auVar60 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar146 = ZEXT1664(auVar60);
      auVar61 = vmaxss_avx512f(auVar60,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar62 = vmaxss_avx512f(auVar60,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar63._8_4_ = 0x7fffffff;
      auVar63._0_8_ = 0x7fffffff7fffffff;
      auVar63._12_4_ = 0x7fffffff;
      auVar63 = vandps_avx512vl((undefined1  [16])aVar8,auVar63);
      auVar64._8_4_ = 0x219392ef;
      auVar64._0_8_ = 0x219392ef219392ef;
      auVar64._12_4_ = 0x219392ef;
      uVar57 = vcmpps_avx512vl(auVar63,auVar64,1);
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = &DAT_3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar63 = vdivps_avx(auVar112,(undefined1  [16])aVar8);
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar24 = (bool)((byte)uVar57 & 1);
      auVar65._0_4_ = (uint)bVar24 * auVar64._0_4_ | (uint)!bVar24 * auVar63._0_4_;
      bVar24 = (bool)((byte)(uVar57 >> 1) & 1);
      auVar65._4_4_ = (uint)bVar24 * auVar64._4_4_ | (uint)!bVar24 * auVar63._4_4_;
      bVar24 = (bool)((byte)(uVar57 >> 2) & 1);
      auVar65._8_4_ = (uint)bVar24 * auVar64._8_4_ | (uint)!bVar24 * auVar63._8_4_;
      bVar24 = (bool)((byte)(uVar57 >> 3) & 1);
      auVar65._12_4_ = (uint)bVar24 * auVar64._12_4_ | (uint)!bVar24 * auVar63._12_4_;
      auVar66._8_4_ = 0x3f7ffffa;
      auVar66._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar66._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar65,auVar66);
      auVar28._8_4_ = 0x3f800003;
      auVar28._0_8_ = 0x3f8000033f800003;
      auVar28._12_4_ = 0x3f800003;
      auVar66 = vmulps_avx512vl(auVar65,auVar28);
      local_2620 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar147 = ZEXT3264(local_2620);
      local_27d8 = local_2390;
      local_2640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar148 = ZEXT3264(local_2640);
      local_2660 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar149 = ZEXT3264(local_2660);
      auVar64 = vucomiss_avx512f(auVar60);
      local_2680 = vbroadcastss_avx512vl(auVar64);
      auVar150 = ZEXT3264(local_2680);
      auVar63 = vmovshdup_avx(auVar64);
      uVar115 = auVar63._0_8_;
      register0x000013c8 = uVar115;
      local_2580 = uVar115;
      register0x000013d0 = uVar115;
      register0x000013d8 = uVar115;
      auVar130 = ZEXT3264(_local_2580);
      vshufpd_avx(auVar64,auVar64,1);
      auVar67._8_4_ = 2;
      auVar67._0_8_ = 0x200000002;
      auVar67._12_4_ = 2;
      auVar67._16_4_ = 2;
      auVar67._20_4_ = 2;
      auVar67._24_4_ = 2;
      auVar67._28_4_ = 2;
      _local_25a0 = vpermps_avx2(auVar67,ZEXT1632(auVar64));
      uVar100 = auVar66._0_4_;
      local_25c0._4_4_ = uVar100;
      local_25c0._0_4_ = uVar100;
      fStack_25b8 = (float)uVar100;
      fStack_25b4 = (float)uVar100;
      fStack_25b0 = (float)uVar100;
      fStack_25ac = (float)uVar100;
      fStack_25a8 = (float)uVar100;
      register0x0000141c = uVar100;
      auVar68._8_4_ = 1;
      auVar68._0_8_ = 0x100000001;
      auVar68._12_4_ = 1;
      auVar68._16_4_ = 1;
      auVar68._20_4_ = 1;
      auVar68._24_4_ = 1;
      auVar68._28_4_ = 1;
      _local_26e0 = vpermps_avx2(auVar68,ZEXT1632(auVar66));
      _local_2540 = vpermps_avx2(auVar67,ZEXT1632(auVar66));
      auVar125 = ZEXT3264(_local_25c0);
      vucomiss_avx512f(auVar60);
      auVar119 = ZEXT3264(_local_26e0);
      vucomiss_avx512f(auVar60);
      auVar123 = ZEXT3264(_local_25a0);
      local_2758 = 0;
      local_2770 = 0x20;
      local_2760 = 0x40;
      local_2778 = 0x60;
      local_2768 = 0x80;
      local_2780 = 0xa0;
      local_2560 = auVar61._0_4_;
      uStack_255c = local_2560;
      uStack_2558 = local_2560;
      uStack_2554 = local_2560;
      uStack_2550 = local_2560;
      uStack_254c = local_2560;
      uStack_2548 = local_2560;
      uStack_2544 = local_2560;
      local_25e0 = auVar62._0_4_;
      fStack_25dc = local_25e0;
      fStack_25d8 = local_25e0;
      fStack_25d4 = local_25e0;
      fStack_25d0 = local_25e0;
      fStack_25cc = local_25e0;
      fStack_25c8 = local_25e0;
      fStack_25c4 = local_25e0;
      auVar67 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar132 = ZEXT3264(auVar67);
      auVar137 = ZEXT3264(CONCAT428(0xfffffff8,
                                    CONCAT424(0xfffffff8,
                                              CONCAT420(0xfffffff8,
                                                        CONCAT416(0xfffffff8,
                                                                  CONCAT412(0xfffffff8,
                                                                            CONCAT48(0xfffffff8,
                                                                                                                                                                          
                                                  0xfffffff8fffffff8)))))));
      local_2738 = context;
      local_2740 = ray;
      do {
        do {
          if (local_27d8 == &local_23a0) {
            return;
          }
          pfVar7 = (float *)(local_27d8 + -1);
          local_27d8 = local_27d8 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar7);
        uVar57 = *local_27d8;
        do {
          if ((uVar57 & 8) == 0) {
            uVar47 = uVar57 & 0xfffffffffffffff0;
            uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar76._4_4_ = uVar100;
            auVar76._0_4_ = uVar100;
            auVar76._8_4_ = uVar100;
            auVar76._12_4_ = uVar100;
            auVar76._16_4_ = uVar100;
            auVar76._20_4_ = uVar100;
            auVar76._24_4_ = uVar100;
            auVar76._28_4_ = uVar100;
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_2758),auVar76,
                                      *(undefined1 (*) [32])(uVar47 + 0x40 + local_2758));
            auVar67 = vsubps_avx512vl(ZEXT1632(auVar63),auVar147._0_32_);
            auVar68 = vmulps_avx512vl(auVar150._0_32_,auVar67);
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_2760),auVar76,
                                      *(undefined1 (*) [32])(uVar47 + 0x40 + local_2760));
            auVar67 = vsubps_avx512vl(ZEXT1632(auVar63),auVar148._0_32_);
            auVar69._4_4_ = auVar130._4_4_ * auVar67._4_4_;
            auVar69._0_4_ = auVar130._0_4_ * auVar67._0_4_;
            auVar69._8_4_ = auVar130._8_4_ * auVar67._8_4_;
            auVar69._12_4_ = auVar130._12_4_ * auVar67._12_4_;
            auVar69._16_4_ = auVar130._16_4_ * auVar67._16_4_;
            auVar69._20_4_ = auVar130._20_4_ * auVar67._20_4_;
            auVar69._24_4_ = auVar130._24_4_ * auVar67._24_4_;
            auVar69._28_4_ = auVar67._28_4_;
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_2768),auVar76,
                                      *(undefined1 (*) [32])(uVar47 + 0x40 + local_2768));
            auVar67 = vsubps_avx512vl(ZEXT1632(auVar63),auVar149._0_32_);
            auVar70._4_4_ = auVar123._4_4_ * auVar67._4_4_;
            auVar70._0_4_ = auVar123._0_4_ * auVar67._0_4_;
            auVar70._8_4_ = auVar123._8_4_ * auVar67._8_4_;
            auVar70._12_4_ = auVar123._12_4_ * auVar67._12_4_;
            auVar70._16_4_ = auVar123._16_4_ * auVar67._16_4_;
            auVar70._20_4_ = auVar123._20_4_ * auVar67._20_4_;
            auVar70._24_4_ = auVar123._24_4_ * auVar67._24_4_;
            auVar70._28_4_ = auVar67._28_4_;
            auVar67 = vmaxps_avx(auVar69,auVar70);
            auVar75._4_4_ = uStack_255c;
            auVar75._0_4_ = local_2560;
            auVar75._8_4_ = uStack_2558;
            auVar75._12_4_ = uStack_2554;
            auVar75._16_4_ = uStack_2550;
            auVar75._20_4_ = uStack_254c;
            auVar75._24_4_ = uStack_2548;
            auVar75._28_4_ = uStack_2544;
            auVar68 = vmaxps_avx(auVar75,auVar68);
            auVar67 = vmaxps_avx(auVar68,auVar67);
            in_ZMM10 = ZEXT3264(auVar67);
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_2770),auVar76,
                                      *(undefined1 (*) [32])(uVar47 + 0x40 + local_2770));
            auVar68 = vsubps_avx512vl(ZEXT1632(auVar63),auVar147._0_32_);
            auVar71._4_4_ = auVar125._4_4_ * auVar68._4_4_;
            auVar71._0_4_ = auVar125._0_4_ * auVar68._0_4_;
            auVar71._8_4_ = auVar125._8_4_ * auVar68._8_4_;
            auVar71._12_4_ = auVar125._12_4_ * auVar68._12_4_;
            auVar71._16_4_ = auVar125._16_4_ * auVar68._16_4_;
            auVar71._20_4_ = auVar125._20_4_ * auVar68._20_4_;
            auVar71._24_4_ = auVar125._24_4_ * auVar68._24_4_;
            auVar71._28_4_ = auVar68._28_4_;
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_2778),auVar76,
                                      *(undefined1 (*) [32])(uVar47 + 0x40 + local_2778));
            auVar68 = vsubps_avx512vl(ZEXT1632(auVar63),auVar148._0_32_);
            auVar72._4_4_ = auVar119._4_4_ * auVar68._4_4_;
            auVar72._0_4_ = auVar119._0_4_ * auVar68._0_4_;
            auVar72._8_4_ = auVar119._8_4_ * auVar68._8_4_;
            auVar72._12_4_ = auVar119._12_4_ * auVar68._12_4_;
            auVar72._16_4_ = auVar119._16_4_ * auVar68._16_4_;
            auVar72._20_4_ = auVar119._20_4_ * auVar68._20_4_;
            auVar72._24_4_ = auVar119._24_4_ * auVar68._24_4_;
            auVar72._28_4_ = auVar68._28_4_;
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_2780),auVar76,
                                      *(undefined1 (*) [32])(uVar47 + 0x40 + local_2780));
            auVar68 = vsubps_avx512vl(ZEXT1632(auVar63),auVar149._0_32_);
            auVar73._4_4_ = auVar68._4_4_ * (float)local_2540._4_4_;
            auVar73._0_4_ = auVar68._0_4_ * (float)local_2540._0_4_;
            auVar73._8_4_ = auVar68._8_4_ * fStack_2538;
            auVar73._12_4_ = auVar68._12_4_ * fStack_2534;
            auVar73._16_4_ = auVar68._16_4_ * fStack_2530;
            auVar73._20_4_ = auVar68._20_4_ * fStack_252c;
            auVar73._24_4_ = auVar68._24_4_ * fStack_2528;
            auVar73._28_4_ = auVar68._28_4_;
            auVar68 = vminps_avx(auVar72,auVar73);
            auVar74._4_4_ = fStack_25dc;
            auVar74._0_4_ = local_25e0;
            auVar74._8_4_ = fStack_25d8;
            auVar74._12_4_ = fStack_25d4;
            auVar74._16_4_ = fStack_25d0;
            auVar74._20_4_ = fStack_25cc;
            auVar74._24_4_ = fStack_25c8;
            auVar74._28_4_ = fStack_25c4;
            auVar69 = vminps_avx(auVar74,auVar71);
            auVar68 = vminps_avx(auVar69,auVar68);
            if (((uint)uVar57 & 7) == 6) {
              uVar115 = vcmpps_avx512vl(auVar67,auVar68,2);
              uVar26 = vcmpps_avx512vl(auVar76,*(undefined1 (*) [32])(uVar47 + 0x1c0),0xd);
              uVar25 = vcmpps_avx512vl(auVar76,*(undefined1 (*) [32])(uVar47 + 0x1e0),1);
              bVar44 = (byte)uVar115 & (byte)uVar26 & (byte)uVar25;
            }
            else {
              uVar115 = vcmpps_avx512vl(auVar67,auVar68,2);
              bVar44 = (byte)uVar115;
            }
            local_2748 = CONCAT44((int)(uVar47 >> 0x20),(uint)bVar44);
          }
          if ((uVar57 & 8) == 0) {
            if (local_2748 == 0) {
              iVar46 = 4;
            }
            else {
              auVar67 = *(undefined1 (*) [32])(uVar57 & 0xfffffffffffffff0);
              auVar68 = ((undefined1 (*) [32])(uVar57 & 0xfffffffffffffff0))[1];
              auVar71 = auVar132._0_32_;
              auVar72 = in_ZMM10._0_32_;
              auVar69 = vpternlogd_avx512vl(auVar71,auVar72,auVar137._0_32_,0xf8);
              uVar57 = local_2748 & 0xffffffff;
              auVar70 = vpcompressd_avx512vl(auVar69);
              bVar24 = (bool)((byte)uVar57 & 1);
              auVar77._0_4_ = (uint)bVar24 * auVar70._0_4_ | (uint)!bVar24 * auVar69._0_4_;
              bVar24 = (bool)((byte)(uVar57 >> 1) & 1);
              auVar77._4_4_ = (uint)bVar24 * auVar70._4_4_ | (uint)!bVar24 * auVar69._4_4_;
              bVar24 = (bool)((byte)(uVar57 >> 2) & 1);
              auVar77._8_4_ = (uint)bVar24 * auVar70._8_4_ | (uint)!bVar24 * auVar69._8_4_;
              bVar24 = (bool)((byte)(uVar57 >> 3) & 1);
              auVar77._12_4_ = (uint)bVar24 * auVar70._12_4_ | (uint)!bVar24 * auVar69._12_4_;
              bVar24 = (bool)((byte)(uVar57 >> 4) & 1);
              auVar77._16_4_ = (uint)bVar24 * auVar70._16_4_ | (uint)!bVar24 * auVar69._16_4_;
              bVar24 = (bool)((byte)(uVar57 >> 5) & 1);
              auVar77._20_4_ = (uint)bVar24 * auVar70._20_4_ | (uint)!bVar24 * auVar69._20_4_;
              bVar24 = (bool)((byte)(uVar57 >> 6) & 1);
              auVar77._24_4_ = (uint)bVar24 * auVar70._24_4_ | (uint)!bVar24 * auVar69._24_4_;
              bVar24 = (bool)((byte)(uVar57 >> 7) & 1);
              auVar77._28_4_ = (uint)bVar24 * auVar70._28_4_ | (uint)!bVar24 * auVar69._28_4_;
              auVar69 = vpermt2q_avx512vl(auVar67,auVar77,auVar68);
              uVar57 = auVar69._0_8_;
              iVar46 = 0;
              uVar47 = local_2748 - 1 & local_2748;
              if (uVar47 != 0) {
                auVar69 = vpshufd_avx2(auVar77,0x55);
                vpermt2q_avx512vl(auVar67,auVar69,auVar68);
                auVar70 = vpminsd_avx2(auVar77,auVar69);
                auVar69 = vpmaxsd_avx2(auVar77,auVar69);
                uVar47 = uVar47 - 1 & uVar47;
                if (uVar47 == 0) {
                  auVar70 = vpermi2q_avx512vl(auVar70,auVar67,auVar68);
                  uVar57 = auVar70._0_8_;
                  auVar67 = vpermt2q_avx512vl(auVar67,auVar69,auVar68);
                  *local_27d8 = auVar67._0_8_;
                  auVar67 = vpermd_avx2(auVar69,auVar72);
                  *(int *)(local_27d8 + 1) = auVar67._0_4_;
                  local_27d8 = local_27d8 + 2;
                  auVar119 = ZEXT3264(_local_26e0);
                }
                else {
                  auVar74 = vpshufd_avx2(auVar77,0xaa);
                  vpermt2q_avx512vl(auVar67,auVar74,auVar68);
                  auVar73 = vpminsd_avx2(auVar70,auVar74);
                  auVar70 = vpmaxsd_avx2(auVar70,auVar74);
                  auVar74 = vpminsd_avx2(auVar69,auVar70);
                  auVar69 = vpmaxsd_avx2(auVar69,auVar70);
                  uVar47 = uVar47 - 1 & uVar47;
                  if (uVar47 == 0) {
                    auVar70 = vpermi2q_avx512vl(auVar73,auVar67,auVar68);
                    uVar57 = auVar70._0_8_;
                    auVar70 = vpermt2q_avx512vl(auVar67,auVar69,auVar68);
                    *local_27d8 = auVar70._0_8_;
                    auVar69 = vpermd_avx2(auVar69,auVar72);
                    *(int *)(local_27d8 + 1) = auVar69._0_4_;
                    auVar67 = vpermt2q_avx512vl(auVar67,auVar74,auVar68);
                    local_27d8[2] = auVar67._0_8_;
                    auVar67 = vpermd_avx2(auVar74,auVar72);
                    *(int *)(local_27d8 + 3) = auVar67._0_4_;
                    local_27d8 = local_27d8 + 4;
                  }
                  else {
                    auVar70 = vpshufd_avx2(auVar77,0xff);
                    vpermt2q_avx512vl(auVar67,auVar70,auVar68);
                    auVar75 = vpminsd_avx2(auVar73,auVar70);
                    auVar70 = vpmaxsd_avx2(auVar73,auVar70);
                    auVar73 = vpminsd_avx2(auVar74,auVar70);
                    auVar70 = vpmaxsd_avx2(auVar74,auVar70);
                    auVar74 = vpminsd_avx2(auVar69,auVar70);
                    auVar69 = vpmaxsd_avx2(auVar69,auVar70);
                    uVar47 = uVar47 - 1 & uVar47;
                    auVar63 = auVar146._0_16_;
                    if (uVar47 != 0) {
                      auVar76 = valignd_avx512vl(auVar77,auVar77,3);
                      auVar70 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar75 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar70,auVar75);
                      auVar70 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar73 = vpermt2d_avx512vl(auVar75,auVar70,auVar73);
                      auVar73 = vpermt2d_avx512vl(auVar73,auVar70,auVar74);
                      auVar70 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar69 = vpermt2d_avx512vl(auVar73,auVar70,auVar69);
                      auVar119 = ZEXT3264(auVar69);
                      uVar57 = uVar47;
                      do {
                        auVar70 = auVar119._0_32_;
                        auVar79._8_4_ = 1;
                        auVar79._0_8_ = 0x100000001;
                        auVar79._12_4_ = 1;
                        auVar79._16_4_ = 1;
                        auVar79._20_4_ = 1;
                        auVar79._24_4_ = 1;
                        auVar79._28_4_ = 1;
                        auVar69 = vpermd_avx2(auVar79,auVar76);
                        auVar76 = valignd_avx512vl(auVar76,auVar76,1);
                        vpermt2q_avx512vl(auVar67,auVar76,auVar68);
                        uVar57 = uVar57 - 1 & uVar57;
                        uVar115 = vpcmpd_avx512vl(auVar69,auVar70,5);
                        auVar69 = vpmaxsd_avx2(auVar69,auVar70);
                        bVar44 = (byte)uVar115 << 1;
                        auVar70 = valignd_avx512vl(auVar70,auVar70,7);
                        bVar24 = (bool)((byte)uVar115 & 1);
                        auVar78._4_4_ = (uint)bVar24 * auVar70._4_4_ | (uint)!bVar24 * auVar69._4_4_
                        ;
                        auVar78._0_4_ = auVar69._0_4_;
                        bVar24 = (bool)(bVar44 >> 2 & 1);
                        auVar78._8_4_ = (uint)bVar24 * auVar70._8_4_ | (uint)!bVar24 * auVar69._8_4_
                        ;
                        bVar24 = (bool)(bVar44 >> 3 & 1);
                        auVar78._12_4_ =
                             (uint)bVar24 * auVar70._12_4_ | (uint)!bVar24 * auVar69._12_4_;
                        bVar24 = (bool)(bVar44 >> 4 & 1);
                        auVar78._16_4_ =
                             (uint)bVar24 * auVar70._16_4_ | (uint)!bVar24 * auVar69._16_4_;
                        bVar24 = (bool)(bVar44 >> 5 & 1);
                        auVar78._20_4_ =
                             (uint)bVar24 * auVar70._20_4_ | (uint)!bVar24 * auVar69._20_4_;
                        bVar24 = (bool)(bVar44 >> 6 & 1);
                        auVar78._24_4_ =
                             (uint)bVar24 * auVar70._24_4_ | (uint)!bVar24 * auVar69._24_4_;
                        auVar78._28_4_ =
                             (uint)(bVar44 >> 7) * auVar70._28_4_ |
                             (uint)!(bool)(bVar44 >> 7) * auVar69._28_4_;
                        auVar119 = ZEXT3264(auVar78);
                      } while (uVar57 != 0);
                      lVar51 = POPCOUNT(uVar47) + 3;
                      do {
                        auVar69 = vpermi2q_avx512vl(auVar78,auVar67,auVar68);
                        *local_27d8 = auVar69._0_8_;
                        auVar70 = auVar119._0_32_;
                        auVar69 = vpermd_avx2(auVar70,auVar72);
                        *(int *)(local_27d8 + 1) = auVar69._0_4_;
                        auVar78 = valignd_avx512vl(auVar70,auVar70,1);
                        local_27d8 = local_27d8 + 2;
                        auVar119 = ZEXT3264(auVar78);
                        lVar51 = lVar51 + -1;
                      } while (lVar51 != 0);
                      auVar67 = vpermt2q_avx512vl(auVar67,auVar78,auVar68);
                      uVar57 = auVar67._0_8_;
                      auVar63 = vxorps_avx512vl(auVar63,auVar63);
                      auVar146 = ZEXT1664(auVar63);
                      auVar147 = ZEXT3264(local_2620);
                      auVar148 = ZEXT3264(local_2640);
                      auVar149 = ZEXT3264(local_2660);
                      auVar150 = ZEXT3264(local_2680);
                      auVar130 = ZEXT3264(auVar130._0_32_);
                      auVar123 = ZEXT3264(auVar123._0_32_);
                      auVar125 = ZEXT3264(auVar125._0_32_);
                      auVar119 = ZEXT3264(_local_26e0);
                      auVar132 = ZEXT3264(auVar71);
                      auVar137 = ZEXT3264(CONCAT428(0xfffffff8,
                                                    CONCAT424(0xfffffff8,
                                                              CONCAT420(0xfffffff8,
                                                                        CONCAT416(0xfffffff8,
                                                                                  CONCAT412(
                                                  0xfffffff8,CONCAT48(0xfffffff8,0xfffffff8fffffff8)
                                                  ))))));
                      in_ZMM10 = ZEXT3264(auVar72);
                      goto LAB_01fda632;
                    }
                    auVar70 = vpermi2q_avx512vl(auVar75,auVar67,auVar68);
                    uVar57 = auVar70._0_8_;
                    auVar70 = vpermt2q_avx512vl(auVar67,auVar69,auVar68);
                    *local_27d8 = auVar70._0_8_;
                    auVar69 = vpermd_avx2(auVar69,auVar72);
                    *(int *)(local_27d8 + 1) = auVar69._0_4_;
                    auVar69 = vpermt2q_avx512vl(auVar67,auVar74,auVar68);
                    local_27d8[2] = auVar69._0_8_;
                    auVar69 = vpermd_avx2(auVar74,auVar72);
                    *(int *)(local_27d8 + 3) = auVar69._0_4_;
                    auVar67 = vpermt2q_avx512vl(auVar67,auVar73,auVar68);
                    local_27d8[4] = auVar67._0_8_;
                    auVar67 = vpermd_avx2(auVar73,auVar72);
                    *(int *)(local_27d8 + 5) = auVar67._0_4_;
                    local_27d8 = local_27d8 + 6;
                    auVar63 = vxorps_avx512vl(auVar63,auVar63);
                    auVar146 = ZEXT1664(auVar63);
                    auVar147 = ZEXT3264(local_2620);
                    auVar148 = ZEXT3264(local_2640);
                    auVar149 = ZEXT3264(local_2660);
                    auVar150 = ZEXT3264(local_2680);
                    auVar130 = ZEXT3264(auVar130._0_32_);
                    auVar132 = ZEXT3264(auVar71);
                  }
                  in_ZMM10 = ZEXT3264(auVar72);
                  auVar125 = ZEXT3264(auVar125._0_32_);
                  auVar123 = ZEXT3264(auVar123._0_32_);
                  auVar119 = ZEXT3264(_local_26e0);
                  auVar137 = ZEXT3264(CONCAT428(0xfffffff8,
                                                CONCAT424(0xfffffff8,
                                                          CONCAT420(0xfffffff8,
                                                                    CONCAT416(0xfffffff8,
                                                                              CONCAT412(0xfffffff8,
                                                                                        CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                }
              }
            }
          }
          else {
            iVar46 = 6;
          }
LAB_01fda632:
        } while (iVar46 == 0);
        if (iVar46 == 6) {
          local_23e0 = in_ZMM10._0_32_;
          local_2788 = (ulong)((uint)uVar57 & 0xf) - 8;
          if (local_2788 != 0) {
            local_2750 = 0;
            local_2798 = uVar57 & 0xfffffffffffffff0;
            do {
              local_27c8 = local_2750 * 0xe0;
              fVar111 = ((ray->super_RayK<1>).dir.field_0.m128[3] -
                        *(float *)(local_2798 + 0xd0 + local_27c8)) *
                        *(float *)(local_2798 + 0xd4 + local_27c8);
              auVar104._8_8_ = 0;
              auVar104._0_8_ = *(ulong *)(local_2798 + 0x40 + local_27c8);
              auVar109._8_8_ = 0;
              auVar109._0_8_ = *(ulong *)(local_2798 + 0x48 + local_27c8);
              uVar115 = vpcmpub_avx512vl(auVar104,auVar109,2);
              auVar67 = vpmovzxbd_avx2(auVar104);
              uVar100 = *(undefined4 *)(local_2798 + 0x7c + local_27c8);
              auVar88._4_4_ = uVar100;
              auVar88._0_4_ = uVar100;
              auVar88._8_4_ = uVar100;
              auVar88._12_4_ = uVar100;
              auVar88._16_4_ = uVar100;
              auVar88._20_4_ = uVar100;
              auVar88._24_4_ = uVar100;
              auVar88._28_4_ = uVar100;
              auVar67 = vcvtdq2ps_avx(auVar67);
              uVar100 = *(undefined4 *)(local_2798 + 0x70 + local_27c8);
              auVar120._4_4_ = uVar100;
              auVar120._0_4_ = uVar100;
              auVar120._8_4_ = uVar100;
              auVar120._12_4_ = uVar100;
              auVar120._16_4_ = uVar100;
              auVar120._20_4_ = uVar100;
              auVar120._24_4_ = uVar100;
              auVar120._28_4_ = uVar100;
              auVar63 = vfmadd213ps_fma(auVar67,auVar88,auVar120);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(local_2798 + 0x88 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar60);
              auVar67 = vcvtdq2ps_avx(auVar67);
              uVar100 = *(undefined4 *)(local_2798 + 0xc4 + local_27c8);
              auVar124._4_4_ = uVar100;
              auVar124._0_4_ = uVar100;
              auVar124._8_4_ = uVar100;
              auVar124._12_4_ = uVar100;
              auVar124._16_4_ = uVar100;
              auVar124._20_4_ = uVar100;
              auVar124._24_4_ = uVar100;
              auVar124._28_4_ = uVar100;
              uVar100 = *(undefined4 *)(local_2798 + 0xb8 + local_27c8);
              auVar126._4_4_ = uVar100;
              auVar126._0_4_ = uVar100;
              auVar126._8_4_ = uVar100;
              auVar126._12_4_ = uVar100;
              auVar126._16_4_ = uVar100;
              auVar126._20_4_ = uVar100;
              auVar126._24_4_ = uVar100;
              auVar126._28_4_ = uVar100;
              auVar64 = vfmadd213ps_fma(auVar67,auVar124,auVar126);
              auVar87._4_4_ = fVar111;
              auVar87._0_4_ = fVar111;
              auVar87._8_4_ = fVar111;
              auVar87._12_4_ = fVar111;
              auVar87._16_4_ = fVar111;
              auVar87._20_4_ = fVar111;
              auVar87._24_4_ = fVar111;
              auVar87._28_4_ = fVar111;
              auVar67 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar63));
              auVar63 = vfmadd213ps_fma(auVar67,auVar87,ZEXT1632(auVar63));
              auVar67 = vpmovzxbd_avx2(auVar109);
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar64 = vfmadd213ps_fma(auVar67,auVar88,auVar120);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = *(ulong *)(local_2798 + 0x90 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar61);
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar66 = vfmadd213ps_fma(auVar67,auVar124,auVar126);
              auVar67 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar64));
              auVar64 = vfmadd213ps_fma(auVar67,auVar87,ZEXT1632(auVar64));
              auVar62._8_8_ = 0;
              auVar62._0_8_ = *(ulong *)(local_2798 + 0x50 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar62);
              uVar100 = *(undefined4 *)(local_2798 + 0x80 + local_27c8);
              auVar89._4_4_ = uVar100;
              auVar89._0_4_ = uVar100;
              auVar89._8_4_ = uVar100;
              auVar89._12_4_ = uVar100;
              auVar89._16_4_ = uVar100;
              auVar89._20_4_ = uVar100;
              auVar89._24_4_ = uVar100;
              auVar89._28_4_ = uVar100;
              uVar100 = *(undefined4 *)(local_2798 + 0x74 + local_27c8);
              auVar121._4_4_ = uVar100;
              auVar121._0_4_ = uVar100;
              auVar121._8_4_ = uVar100;
              auVar121._12_4_ = uVar100;
              auVar121._16_4_ = uVar100;
              auVar121._20_4_ = uVar100;
              auVar121._24_4_ = uVar100;
              auVar121._28_4_ = uVar100;
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar66 = vfmadd213ps_fma(auVar67,auVar89,auVar121);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(local_2798 + 0x98 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar9);
              uVar100 = *(undefined4 *)(local_2798 + 200 + local_27c8);
              auVar127._4_4_ = uVar100;
              auVar127._0_4_ = uVar100;
              auVar127._8_4_ = uVar100;
              auVar127._12_4_ = uVar100;
              auVar127._16_4_ = uVar100;
              auVar127._20_4_ = uVar100;
              auVar127._24_4_ = uVar100;
              auVar127._28_4_ = uVar100;
              auVar67 = vcvtdq2ps_avx(auVar67);
              uVar100 = *(undefined4 *)(local_2798 + 0xbc + local_27c8);
              auVar131._4_4_ = uVar100;
              auVar131._0_4_ = uVar100;
              auVar131._8_4_ = uVar100;
              auVar131._12_4_ = uVar100;
              auVar131._16_4_ = uVar100;
              auVar131._20_4_ = uVar100;
              auVar131._24_4_ = uVar100;
              auVar131._28_4_ = uVar100;
              auVar28 = vfmadd213ps_fma(auVar67,auVar127,auVar131);
              auVar67 = vsubps_avx(ZEXT1632(auVar28),ZEXT1632(auVar66));
              auVar66 = vfmadd213ps_fma(auVar67,auVar87,ZEXT1632(auVar66));
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *(ulong *)(local_2798 + 0x58 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar10);
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar28 = vfmadd213ps_fma(auVar67,auVar89,auVar121);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *(ulong *)(local_2798 + 0xa0 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar11);
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar60 = vfmadd213ps_fma(auVar67,auVar127,auVar131);
              auVar67 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar28));
              auVar28 = vfmadd213ps_fma(auVar67,auVar87,ZEXT1632(auVar28));
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)(local_2798 + 0x60 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar12);
              auVar67 = vcvtdq2ps_avx(auVar67);
              uVar100 = *(undefined4 *)(local_2798 + 0x84 + local_27c8);
              auVar122._4_4_ = uVar100;
              auVar122._0_4_ = uVar100;
              auVar122._8_4_ = uVar100;
              auVar122._12_4_ = uVar100;
              auVar122._16_4_ = uVar100;
              auVar122._20_4_ = uVar100;
              auVar122._24_4_ = uVar100;
              auVar122._28_4_ = uVar100;
              uVar100 = *(undefined4 *)(local_2798 + 0x78 + local_27c8);
              auVar128._4_4_ = uVar100;
              auVar128._0_4_ = uVar100;
              auVar128._8_4_ = uVar100;
              auVar128._12_4_ = uVar100;
              auVar128._16_4_ = uVar100;
              auVar128._20_4_ = uVar100;
              auVar128._24_4_ = uVar100;
              auVar128._28_4_ = uVar100;
              auVar60 = vfmadd213ps_fma(auVar67,auVar122,auVar128);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = *(ulong *)(local_2798 + 0xa8 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar13);
              uVar100 = *(undefined4 *)(local_2798 + 0xcc + local_27c8);
              auVar133._4_4_ = uVar100;
              auVar133._0_4_ = uVar100;
              auVar133._8_4_ = uVar100;
              auVar133._12_4_ = uVar100;
              auVar133._16_4_ = uVar100;
              auVar133._20_4_ = uVar100;
              auVar133._24_4_ = uVar100;
              auVar133._28_4_ = uVar100;
              uVar100 = *(undefined4 *)(local_2798 + 0xc0 + local_27c8);
              auVar138._4_4_ = uVar100;
              auVar138._0_4_ = uVar100;
              auVar138._8_4_ = uVar100;
              auVar138._12_4_ = uVar100;
              auVar138._16_4_ = uVar100;
              auVar138._20_4_ = uVar100;
              auVar138._24_4_ = uVar100;
              auVar138._28_4_ = uVar100;
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar61 = vfmadd213ps_fma(auVar67,auVar133,auVar138);
              auVar67 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar60));
              auVar60 = vfmadd213ps_fma(auVar67,auVar87,ZEXT1632(auVar60));
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)(local_2798 + 0x68 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar14);
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar61 = vfmadd213ps_fma(auVar67,auVar122,auVar128);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)(local_2798 + 0xb0 + local_27c8);
              auVar67 = vpmovzxbd_avx2(auVar15);
              auVar67 = vcvtdq2ps_avx(auVar67);
              auVar62 = vfmadd213ps_fma(auVar67,auVar133,auVar138);
              auVar67 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar61));
              auVar61 = vfmadd213ps_fma(auVar67,auVar87,ZEXT1632(auVar61));
              auVar67 = vsubps_avx512vl(ZEXT1632(auVar63),auVar147._0_32_);
              auVar67 = vmulps_avx512vl(auVar150._0_32_,auVar67);
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar66),auVar148._0_32_);
              auVar80._4_4_ = auVar68._4_4_ * (float)local_2580._4_4_;
              auVar80._0_4_ = auVar68._0_4_ * (float)local_2580._0_4_;
              auVar80._8_4_ = auVar68._8_4_ * fStack_2578;
              auVar80._12_4_ = auVar68._12_4_ * fStack_2574;
              auVar80._16_4_ = auVar68._16_4_ * fStack_2570;
              auVar80._20_4_ = auVar68._20_4_ * fStack_256c;
              auVar80._24_4_ = auVar68._24_4_ * fStack_2568;
              auVar80._28_4_ = auVar68._28_4_;
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar60),auVar149._0_32_);
              auVar81._4_4_ = auVar68._4_4_ * (float)local_25a0._4_4_;
              auVar81._0_4_ = auVar68._0_4_ * (float)local_25a0._0_4_;
              auVar81._8_4_ = auVar68._8_4_ * fStack_2598;
              auVar81._12_4_ = auVar68._12_4_ * fStack_2594;
              auVar81._16_4_ = auVar68._16_4_ * fStack_2590;
              auVar81._20_4_ = auVar68._20_4_ * fStack_258c;
              auVar81._24_4_ = auVar68._24_4_ * fStack_2588;
              auVar81._28_4_ = auVar68._28_4_;
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar64),auVar147._0_32_);
              auVar82._4_4_ = auVar68._4_4_ * (float)local_25c0._4_4_;
              auVar82._0_4_ = auVar68._0_4_ * (float)local_25c0._0_4_;
              auVar82._8_4_ = auVar68._8_4_ * fStack_25b8;
              auVar82._12_4_ = auVar68._12_4_ * fStack_25b4;
              auVar82._16_4_ = auVar68._16_4_ * fStack_25b0;
              auVar82._20_4_ = auVar68._20_4_ * fStack_25ac;
              auVar82._24_4_ = auVar68._24_4_ * fStack_25a8;
              auVar82._28_4_ = auVar68._28_4_;
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar28),auVar148._0_32_);
              auVar83._4_4_ = auVar68._4_4_ * (float)local_26e0._4_4_;
              auVar83._0_4_ = auVar68._0_4_ * (float)local_26e0._0_4_;
              auVar83._8_4_ = auVar68._8_4_ * fStack_26d8;
              auVar83._12_4_ = auVar68._12_4_ * fStack_26d4;
              auVar83._16_4_ = auVar68._16_4_ * fStack_26d0;
              auVar83._20_4_ = auVar68._20_4_ * fStack_26cc;
              auVar83._24_4_ = auVar68._24_4_ * fStack_26c8;
              auVar83._28_4_ = auVar68._28_4_;
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar61),auVar149._0_32_);
              auVar84._4_4_ = auVar68._4_4_ * (float)local_2540._4_4_;
              auVar84._0_4_ = auVar68._0_4_ * (float)local_2540._0_4_;
              auVar84._8_4_ = auVar68._8_4_ * fStack_2538;
              auVar84._12_4_ = auVar68._12_4_ * fStack_2534;
              auVar84._16_4_ = auVar68._16_4_ * fStack_2530;
              auVar84._20_4_ = auVar68._20_4_ * fStack_252c;
              auVar84._24_4_ = auVar68._24_4_ * fStack_2528;
              auVar84._28_4_ = auVar68._28_4_;
              auVar68 = vpminsd_avx2(auVar67,auVar82);
              auVar67 = vpmaxsd_avx2(auVar67,auVar82);
              auVar69 = vpminsd_avx2(auVar80,auVar83);
              auVar68 = vpmaxsd_avx2(auVar68,auVar69);
              auVar69 = vpmaxsd_avx2(auVar80,auVar83);
              auVar70 = vpminsd_avx2(auVar67,auVar69);
              auVar69 = vpminsd_avx2(auVar81,auVar84);
              auVar67 = vpmaxsd_avx2(auVar81,auVar84);
              auVar86._4_4_ = uStack_255c;
              auVar86._0_4_ = local_2560;
              auVar86._8_4_ = uStack_2558;
              auVar86._12_4_ = uStack_2554;
              auVar86._16_4_ = uStack_2550;
              auVar86._20_4_ = uStack_254c;
              auVar86._24_4_ = uStack_2548;
              auVar86._28_4_ = uStack_2544;
              auVar69 = vpmaxsd_avx2(auVar69,auVar86);
              local_23c0 = vpmaxsd_avx2(auVar68,auVar69);
              auVar85._4_4_ = fStack_25dc;
              auVar85._0_4_ = local_25e0;
              auVar85._8_4_ = fStack_25d8;
              auVar85._12_4_ = fStack_25d4;
              auVar85._16_4_ = fStack_25d0;
              auVar85._20_4_ = fStack_25cc;
              auVar85._24_4_ = fStack_25c8;
              auVar85._28_4_ = fStack_25c4;
              auVar67 = vpminsd_avx2(auVar67,auVar85);
              auVar67 = vpminsd_avx2(auVar70,auVar67);
              uVar26 = vpcmpd_avx512vl(local_23c0,auVar67,2);
              if ((byte)((byte)uVar26 & (byte)uVar115) != 0) {
                local_27c8 = local_27c8 + local_2798;
                local_2718 = (ulong)(byte)((byte)uVar26 & (byte)uVar115);
                do {
                  pRVar43 = local_2740;
                  lVar51 = 0;
                  for (uVar57 = local_2718; (uVar57 & 1) == 0;
                      uVar57 = uVar57 >> 1 | 0x8000000000000000) {
                    lVar51 = lVar51 + 1;
                  }
                  fVar111 = (ray->super_RayK<1>).tfar;
                  if (*(float *)(local_23c0 + lVar51 * 4) <= fVar111) {
                    uVar16 = *(ushort *)(local_27c8 + lVar51 * 8);
                    uVar17 = *(ushort *)(local_27c8 + 2 + lVar51 * 8);
                    local_27a4 = CONCAT22(0,uVar17);
                    local_2600._0_4_ = local_27a4;
                    uVar58 = *(uint *)(local_27c8 + 0xd8);
                    uVar47 = (ulong)uVar58;
                    uVar18 = *(uint *)(local_27c8 + 4 + lVar51 * 8);
                    local_2720 = context->scene;
                    pGVar19 = (local_2720->geometries).items[uVar47].ptr;
                    local_2728 = *(long *)&pGVar19->field_0x58;
                    local_2790 = (ulong)uVar18;
                    local_2730 = pGVar19[1].super_RefCount.refCounter.
                                 super___atomic_base<unsigned_long>._M_i * (ulong)uVar18;
                    fVar108 = (pGVar19->time_range).lower;
                    fVar108 = pGVar19->fnumTimeSegments *
                              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar108) /
                              ((pGVar19->time_range).upper - fVar108));
                    auVar63 = vroundss_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),9);
                    auVar63 = vminss_avx(auVar63,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
                    auVar65 = auVar146._0_16_;
                    auVar62 = vmaxss_avx512f(auVar65,auVar63);
                    local_27a0 = uVar16 & 0x7fff;
                    local_27a4 = local_27a4 & 0x7fff;
                    uVar50 = *(uint *)(local_2728 + 4 + local_2730);
                    uVar49 = (ulong)uVar50;
                    uVar56 = (ulong)(uVar50 * local_27a4 +
                                    *(int *)(local_2728 + local_2730) + local_27a0);
                    local_27b8 = *(long *)&pGVar19[2].numPrimitives;
                    lVar55 = (long)(int)auVar62._0_4_ * 0x38;
                    lVar20 = *(long *)(local_27b8 + 0x10 + lVar55);
                    lVar21 = *(long *)(local_27b8 + lVar55);
                    auVar63 = *(undefined1 (*) [16])(lVar21 + lVar20 * uVar56);
                    lVar22 = *(long *)(local_27b8 + 0x48 + lVar55);
                    auVar64 = *(undefined1 (*) [16])(lVar21 + (uVar56 + 1) * lVar20);
                    lVar51 = uVar56 + uVar49;
                    auVar66 = *(undefined1 (*) [16])(lVar21 + lVar51 * lVar20);
                    lVar53 = uVar56 + uVar49 + 1;
                    auVar28 = *(undefined1 (*) [16])(lVar21 + lVar53 * lVar20);
                    uVar57 = (ulong)(-1 < (short)uVar16);
                    lVar48 = uVar56 + uVar57 + 1;
                    auVar60 = *(undefined1 (*) [16])(lVar21 + lVar48 * lVar20);
                    lVar52 = uVar57 + lVar53;
                    auVar61 = *(undefined1 (*) [16])(lVar21 + lVar52 * lVar20);
                    uVar57 = 0;
                    if (-1 < (short)uVar17) {
                      uVar57 = uVar49;
                    }
                    auVar112 = *(undefined1 (*) [16])(lVar21 + (lVar51 + uVar57) * lVar20);
                    auVar9 = *(undefined1 (*) [16])(lVar21 + (lVar53 + uVar57) * lVar20);
                    auVar10 = *(undefined1 (*) [16])(lVar21 + lVar20 * (uVar57 + lVar52));
                    lVar20 = *(long *)(local_27b8 + 0x38 + lVar55);
                    fVar108 = fVar108 - auVar62._0_4_;
                    auVar105._4_4_ = fVar108;
                    auVar105._0_4_ = fVar108;
                    auVar105._8_4_ = fVar108;
                    auVar105._12_4_ = fVar108;
                    auVar62 = vsubps_avx(*(undefined1 (*) [16])(lVar20 + lVar22 * uVar56),auVar63);
                    auVar11 = vfmadd213ps_fma(auVar62,auVar105,auVar63);
                    auVar63 = vsubps_avx(*(undefined1 (*) [16])(lVar20 + lVar22 * (uVar56 + 1)),
                                         auVar64);
                    auVar12 = vfmadd213ps_fma(auVar63,auVar105,auVar64);
                    auVar63 = vsubps_avx(*(undefined1 (*) [16])(lVar20 + lVar22 * lVar51),auVar66);
                    auVar13 = vfmadd213ps_fma(auVar63,auVar105,auVar66);
                    auVar63 = vsubps_avx(*(undefined1 (*) [16])(lVar20 + lVar22 * lVar53),auVar28);
                    auVar14 = vfmadd213ps_fma(auVar63,auVar105,auVar28);
                    auVar63 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar22 * lVar48),
                                              auVar60);
                    auVar64 = vfmadd213ps_fma(auVar63,auVar105,auVar60);
                    auVar63 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar22 * lVar52),
                                              auVar61);
                    auVar15 = vfmadd213ps_fma(auVar63,auVar105,auVar61);
                    auVar63 = vsubps_avx512vl(*(undefined1 (*) [16])
                                               (lVar20 + lVar22 * (lVar51 + uVar57)),auVar112);
                    auVar112 = vfmadd213ps_fma(auVar63,auVar105,auVar112);
                    auVar63 = vsubps_avx512vl(*(undefined1 (*) [16])
                                               (lVar20 + lVar22 * (lVar53 + uVar57)),auVar9);
                    auVar9 = vfmadd213ps_fma(auVar63,auVar105,auVar9);
                    auVar63 = vsubps_avx512vl(*(undefined1 (*) [16])
                                               (lVar20 + (uVar57 + lVar52) * lVar22),auVar10);
                    auVar10 = vfmadd213ps_fma(auVar63,auVar105,auVar10);
                    auVar66 = vunpcklps_avx(auVar12,auVar15);
                    auVar63 = vunpckhps_avx(auVar12,auVar15);
                    auVar28 = vunpcklps_avx(auVar64,auVar14);
                    auVar64 = vunpckhps_avx(auVar64,auVar14);
                    auVar60 = vunpcklps_avx(auVar63,auVar64);
                    auVar61 = vunpcklps_avx(auVar66,auVar28);
                    auVar63 = vunpckhps_avx(auVar66,auVar28);
                    auVar28 = vunpcklps_avx(auVar13,auVar9);
                    auVar64 = vunpckhps_avx(auVar13,auVar9);
                    auVar62 = vunpcklps_avx(auVar14,auVar112);
                    auVar66 = vunpckhps_avx(auVar14,auVar112);
                    auVar66 = vunpcklps_avx(auVar64,auVar66);
                    auVar112 = vunpcklps_avx(auVar28,auVar62);
                    auVar64 = vunpckhps_avx(auVar28,auVar62);
                    auVar116._16_16_ = auVar9;
                    auVar116._0_16_ = auVar13;
                    auVar113._16_16_ = auVar15;
                    auVar113._0_16_ = auVar12;
                    auVar67 = vunpcklps_avx(auVar113,auVar116);
                    auVar134._16_16_ = auVar10;
                    auVar134._0_16_ = auVar14;
                    auVar110._16_16_ = auVar14;
                    auVar110._0_16_ = auVar11;
                    auVar68 = vunpcklps_avx(auVar110,auVar134);
                    auVar70 = vunpcklps_avx(auVar68,auVar67);
                    auVar68 = vunpckhps_avx(auVar68,auVar67);
                    auVar67 = vunpckhps_avx(auVar113,auVar116);
                    auVar69 = vunpckhps_avx(auVar110,auVar134);
                    auVar69 = vunpcklps_avx(auVar69,auVar67);
                    auVar114._16_16_ = auVar61;
                    auVar114._0_16_ = auVar61;
                    auVar106._16_16_ = auVar63;
                    auVar106._0_16_ = auVar63;
                    auVar117._16_16_ = auVar60;
                    auVar117._0_16_ = auVar60;
                    auVar139._16_16_ = auVar112;
                    auVar139._0_16_ = auVar112;
                    auVar142._16_16_ = auVar64;
                    auVar142._0_16_ = auVar64;
                    auVar143._16_16_ = auVar66;
                    auVar143._0_16_ = auVar66;
                    uVar100 = *(undefined4 *)&(local_2740->super_RayK<1>).org.field_0;
                    auVar145._4_4_ = uVar100;
                    auVar145._0_4_ = uVar100;
                    auVar145._8_4_ = uVar100;
                    auVar145._12_4_ = uVar100;
                    auVar145._16_4_ = uVar100;
                    auVar145._20_4_ = uVar100;
                    auVar145._24_4_ = uVar100;
                    auVar145._28_4_ = uVar100;
                    auVar71 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(local_2740->super_RayK<1>).org.field_0.m128
                                                       [1]));
                    auVar72 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(local_2740->super_RayK<1>).org.field_0.m128
                                                       [2]));
                    uVar100 = *(undefined4 *)&(local_2740->super_RayK<1>).dir.field_0;
                    auVar129._4_4_ = uVar100;
                    auVar129._0_4_ = uVar100;
                    auVar129._8_4_ = uVar100;
                    auVar129._12_4_ = uVar100;
                    auVar129._16_4_ = uVar100;
                    auVar129._20_4_ = uVar100;
                    auVar129._24_4_ = uVar100;
                    auVar129._28_4_ = uVar100;
                    local_24c0 = &local_27d9;
                    uVar100 = *(undefined4 *)((long)&(local_2740->super_RayK<1>).dir.field_0 + 4);
                    auVar135._4_4_ = uVar100;
                    auVar135._0_4_ = uVar100;
                    auVar135._8_4_ = uVar100;
                    auVar135._12_4_ = uVar100;
                    auVar135._16_4_ = uVar100;
                    auVar135._20_4_ = uVar100;
                    auVar135._24_4_ = uVar100;
                    auVar135._28_4_ = uVar100;
                    fVar108 = (local_2740->super_RayK<1>).dir.field_0.m128[2];
                    auVar141._4_4_ = fVar108;
                    auVar141._0_4_ = fVar108;
                    auVar141._8_4_ = fVar108;
                    auVar141._12_4_ = fVar108;
                    auVar141._16_4_ = fVar108;
                    auVar141._20_4_ = fVar108;
                    auVar141._24_4_ = fVar108;
                    auVar141._28_4_ = fVar108;
                    auVar67 = vsubps_avx(auVar70,auVar145);
                    auVar70 = vsubps_avx512vl(auVar68,auVar71);
                    auVar69 = vsubps_avx512vl(auVar69,auVar72);
                    auVar68 = vsubps_avx(auVar114,auVar145);
                    auVar73 = vsubps_avx512vl(auVar106,auVar71);
                    auVar74 = vsubps_avx512vl(auVar117,auVar72);
                    auVar75 = vsubps_avx512vl(auVar139,auVar145);
                    auVar71 = vsubps_avx512vl(auVar142,auVar71);
                    auVar72 = vsubps_avx512vl(auVar143,auVar72);
                    auVar76 = vsubps_avx512vl(auVar75,auVar67);
                    auVar77 = vsubps_avx512vl(auVar71,auVar70);
                    auVar78 = vsubps_avx512vl(auVar72,auVar69);
                    auVar79 = vsubps_avx512vl(auVar67,auVar68);
                    auVar80 = vsubps_avx512vl(auVar70,auVar73);
                    auVar81 = vsubps_avx512vl(auVar69,auVar74);
                    auVar82 = vsubps_avx512vl(auVar68,auVar75);
                    auVar83 = vsubps_avx512vl(auVar73,auVar71);
                    auVar84 = vsubps_avx512vl(auVar74,auVar72);
                    auVar85 = vaddps_avx512vl(auVar75,auVar67);
                    auVar86 = vaddps_avx512vl(auVar71,auVar70);
                    auVar87 = vaddps_avx512vl(auVar72,auVar69);
                    auVar88 = vmulps_avx512vl(auVar86,auVar78);
                    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar77,auVar87);
                    auVar87 = vmulps_avx512vl(auVar87,auVar76);
                    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar78,auVar85);
                    auVar85 = vmulps_avx512vl(auVar85,auVar77);
                    auVar63 = vfmsub231ps_fma(auVar85,auVar76,auVar86);
                    auVar140._0_4_ = fVar108 * auVar63._0_4_;
                    auVar140._4_4_ = fVar108 * auVar63._4_4_;
                    auVar140._8_4_ = fVar108 * auVar63._8_4_;
                    auVar140._12_4_ = fVar108 * auVar63._12_4_;
                    auVar140._16_4_ = fVar108 * 0.0;
                    auVar140._20_4_ = fVar108 * 0.0;
                    auVar140._24_4_ = fVar108 * 0.0;
                    auVar140._28_4_ = 0;
                    auVar85 = vfmadd231ps_avx512vl(auVar140,auVar135,auVar87);
                    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar129,auVar88);
                    auVar144._0_4_ = auVar67._0_4_ + auVar68._0_4_;
                    auVar144._4_4_ = auVar67._4_4_ + auVar68._4_4_;
                    auVar144._8_4_ = auVar67._8_4_ + auVar68._8_4_;
                    auVar144._12_4_ = auVar67._12_4_ + auVar68._12_4_;
                    auVar144._16_4_ = auVar67._16_4_ + auVar68._16_4_;
                    auVar144._20_4_ = auVar67._20_4_ + auVar68._20_4_;
                    auVar144._24_4_ = auVar67._24_4_ + auVar68._24_4_;
                    auVar144._28_4_ = auVar67._28_4_ + auVar68._28_4_;
                    auVar86 = vaddps_avx512vl(auVar70,auVar73);
                    auVar87 = vaddps_avx512vl(auVar69,auVar74);
                    auVar88 = vmulps_avx512vl(auVar86,auVar81);
                    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar80,auVar87);
                    auVar87 = vmulps_avx512vl(auVar87,auVar79);
                    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar81,auVar144);
                    auVar89 = vmulps_avx512vl(auVar144,auVar80);
                    auVar86 = vfmsub231ps_avx512vl(auVar89,auVar79,auVar86);
                    auVar37._4_4_ = fVar108 * auVar86._4_4_;
                    auVar37._0_4_ = fVar108 * auVar86._0_4_;
                    auVar37._8_4_ = fVar108 * auVar86._8_4_;
                    auVar37._12_4_ = fVar108 * auVar86._12_4_;
                    auVar37._16_4_ = fVar108 * auVar86._16_4_;
                    auVar37._20_4_ = fVar108 * auVar86._20_4_;
                    auVar37._24_4_ = fVar108 * auVar86._24_4_;
                    auVar37._28_4_ = auVar86._28_4_;
                    auVar86 = vfmadd231ps_avx512vl(auVar37,auVar135,auVar87);
                    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar129,auVar88);
                    auVar68 = vaddps_avx512vl(auVar68,auVar75);
                    auVar71 = vaddps_avx512vl(auVar73,auVar71);
                    auVar72 = vaddps_avx512vl(auVar74,auVar72);
                    auVar73 = vmulps_avx512vl(auVar71,auVar84);
                    auVar73 = vfmsub231ps_avx512vl(auVar73,auVar83,auVar72);
                    auVar72 = vmulps_avx512vl(auVar72,auVar82);
                    auVar72 = vfmsub231ps_avx512vl(auVar72,auVar84,auVar68);
                    auVar38._4_4_ = auVar68._4_4_ * auVar83._4_4_;
                    auVar38._0_4_ = auVar68._0_4_ * auVar83._0_4_;
                    auVar38._8_4_ = auVar68._8_4_ * auVar83._8_4_;
                    auVar38._12_4_ = auVar68._12_4_ * auVar83._12_4_;
                    auVar38._16_4_ = auVar68._16_4_ * auVar83._16_4_;
                    auVar38._20_4_ = auVar68._20_4_ * auVar83._20_4_;
                    auVar38._24_4_ = auVar68._24_4_ * auVar83._24_4_;
                    auVar38._28_4_ = auVar68._28_4_;
                    auVar63 = vfmsub231ps_fma(auVar38,auVar82,auVar71);
                    auVar68 = vmulps_avx512vl(auVar141,ZEXT1632(auVar63));
                    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar135,auVar72);
                    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar129,auVar73);
                    auVar107._0_4_ = auVar85._0_4_ + auVar86._0_4_;
                    auVar107._4_4_ = auVar85._4_4_ + auVar86._4_4_;
                    auVar107._8_4_ = auVar85._8_4_ + auVar86._8_4_;
                    auVar107._12_4_ = auVar85._12_4_ + auVar86._12_4_;
                    auVar107._16_4_ = auVar85._16_4_ + auVar86._16_4_;
                    auVar107._20_4_ = auVar85._20_4_ + auVar86._20_4_;
                    auVar107._24_4_ = auVar85._24_4_ + auVar86._24_4_;
                    auVar107._28_4_ = auVar85._28_4_ + auVar86._28_4_;
                    local_24e0 = vaddps_avx512vl(auVar68,auVar107);
                    auVar29._8_4_ = 0x7fffffff;
                    auVar29._0_8_ = 0x7fffffff7fffffff;
                    auVar29._12_4_ = 0x7fffffff;
                    auVar29._16_4_ = 0x7fffffff;
                    auVar29._20_4_ = 0x7fffffff;
                    auVar29._24_4_ = 0x7fffffff;
                    auVar29._28_4_ = 0x7fffffff;
                    vandps_avx512vl(local_24e0,auVar29);
                    auVar30._8_4_ = 0x34000000;
                    auVar30._0_8_ = 0x3400000034000000;
                    auVar30._12_4_ = 0x34000000;
                    auVar30._16_4_ = 0x34000000;
                    auVar30._20_4_ = 0x34000000;
                    auVar30._24_4_ = 0x34000000;
                    auVar30._28_4_ = 0x34000000;
                    auVar71 = vmulps_avx512vl(local_24e0,auVar30);
                    auVar72 = vminps_avx512vl(auVar85,auVar86);
                    auVar72 = vminps_avx512vl(auVar72,auVar68);
                    auVar31._8_4_ = 0x80000000;
                    auVar31._0_8_ = 0x8000000080000000;
                    auVar31._12_4_ = 0x80000000;
                    auVar31._16_4_ = 0x80000000;
                    auVar31._20_4_ = 0x80000000;
                    auVar31._24_4_ = 0x80000000;
                    auVar31._28_4_ = 0x80000000;
                    auVar73 = vxorps_avx512vl(auVar71,auVar31);
                    uVar115 = vcmpps_avx512vl(auVar72,auVar73,5);
                    auVar72 = vmaxps_avx512vl(auVar85,auVar86);
                    auVar68 = vmaxps_avx512vl(auVar72,auVar68);
                    uVar26 = vcmpps_avx512vl(auVar68,auVar71,2);
                    bVar44 = (byte)uVar115 | (byte)uVar26;
                    context = local_2738;
                    ray = pRVar43;
                    if (bVar44 != 0) {
                      auVar68 = vmulps_avx512vl(auVar78,auVar80);
                      auVar71 = vmulps_avx512vl(auVar76,auVar81);
                      auVar72 = vmulps_avx512vl(auVar77,auVar79);
                      auVar73 = vmulps_avx512vl(auVar81,auVar83);
                      auVar74 = vmulps_avx512vl(auVar79,auVar84);
                      auVar75 = vmulps_avx512vl(auVar80,auVar82);
                      auVar77 = vfmsub213ps_avx512vl(auVar77,auVar81,auVar68);
                      auVar78 = vfmsub213ps_avx512vl(auVar78,auVar79,auVar71);
                      auVar76 = vfmsub213ps_avx512vl(auVar76,auVar80,auVar72);
                      auVar80 = vfmsub213ps_avx512vl(auVar84,auVar80,auVar73);
                      auVar81 = vfmsub213ps_avx512vl(auVar82,auVar81,auVar74);
                      auVar79 = vfmsub213ps_avx512vl(auVar83,auVar79,auVar75);
                      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      vandps_avx512vl(auVar68,auVar82);
                      vandps_avx512vl(auVar73,auVar82);
                      uVar57 = vcmpps_avx512vl(auVar82,auVar82,1);
                      vandps_avx512vl(auVar71,auVar82);
                      vandps_avx512vl(auVar74,auVar82);
                      uVar49 = vcmpps_avx512vl(auVar82,auVar82,1);
                      vandps_avx512vl(auVar72,auVar82);
                      vandps_avx512vl(auVar75,auVar82);
                      uVar56 = vcmpps_avx512vl(auVar82,auVar82,1);
                      bVar24 = (bool)((byte)uVar57 & 1);
                      auVar90._0_4_ =
                           (float)((uint)bVar24 * auVar77._0_4_ | (uint)!bVar24 * auVar80._0_4_);
                      bVar24 = (bool)((byte)(uVar57 >> 1) & 1);
                      auVar90._4_4_ =
                           (float)((uint)bVar24 * auVar77._4_4_ | (uint)!bVar24 * auVar80._4_4_);
                      bVar24 = (bool)((byte)(uVar57 >> 2) & 1);
                      auVar90._8_4_ =
                           (float)((uint)bVar24 * auVar77._8_4_ | (uint)!bVar24 * auVar80._8_4_);
                      bVar24 = (bool)((byte)(uVar57 >> 3) & 1);
                      auVar90._12_4_ =
                           (float)((uint)bVar24 * auVar77._12_4_ | (uint)!bVar24 * auVar80._12_4_);
                      bVar24 = (bool)((byte)(uVar57 >> 4) & 1);
                      auVar90._16_4_ =
                           (float)((uint)bVar24 * auVar77._16_4_ | (uint)!bVar24 * auVar80._16_4_);
                      bVar24 = (bool)((byte)(uVar57 >> 5) & 1);
                      auVar90._20_4_ =
                           (float)((uint)bVar24 * auVar77._20_4_ | (uint)!bVar24 * auVar80._20_4_);
                      bVar24 = (bool)((byte)(uVar57 >> 6) & 1);
                      auVar90._24_4_ =
                           (float)((uint)bVar24 * auVar77._24_4_ | (uint)!bVar24 * auVar80._24_4_);
                      bVar24 = SUB81(uVar57 >> 7,0);
                      auVar90._28_4_ =
                           (uint)bVar24 * auVar77._28_4_ | (uint)!bVar24 * auVar80._28_4_;
                      bVar24 = (bool)((byte)uVar49 & 1);
                      auVar91._0_4_ =
                           (float)((uint)bVar24 * auVar78._0_4_ | (uint)!bVar24 * auVar81._0_4_);
                      bVar24 = (bool)((byte)(uVar49 >> 1) & 1);
                      auVar91._4_4_ =
                           (float)((uint)bVar24 * auVar78._4_4_ | (uint)!bVar24 * auVar81._4_4_);
                      bVar24 = (bool)((byte)(uVar49 >> 2) & 1);
                      auVar91._8_4_ =
                           (float)((uint)bVar24 * auVar78._8_4_ | (uint)!bVar24 * auVar81._8_4_);
                      bVar24 = (bool)((byte)(uVar49 >> 3) & 1);
                      auVar91._12_4_ =
                           (float)((uint)bVar24 * auVar78._12_4_ | (uint)!bVar24 * auVar81._12_4_);
                      bVar24 = (bool)((byte)(uVar49 >> 4) & 1);
                      auVar91._16_4_ =
                           (float)((uint)bVar24 * auVar78._16_4_ | (uint)!bVar24 * auVar81._16_4_);
                      bVar24 = (bool)((byte)(uVar49 >> 5) & 1);
                      auVar91._20_4_ =
                           (float)((uint)bVar24 * auVar78._20_4_ | (uint)!bVar24 * auVar81._20_4_);
                      bVar24 = (bool)((byte)(uVar49 >> 6) & 1);
                      auVar91._24_4_ =
                           (float)((uint)bVar24 * auVar78._24_4_ | (uint)!bVar24 * auVar81._24_4_);
                      bVar24 = SUB81(uVar49 >> 7,0);
                      auVar91._28_4_ =
                           (uint)bVar24 * auVar78._28_4_ | (uint)!bVar24 * auVar81._28_4_;
                      bVar24 = (bool)((byte)uVar56 & 1);
                      fVar59 = (float)((uint)bVar24 * auVar76._0_4_ | (uint)!bVar24 * auVar79._0_4_)
                      ;
                      bVar24 = (bool)((byte)(uVar56 >> 1) & 1);
                      fVar94 = (float)((uint)bVar24 * auVar76._4_4_ | (uint)!bVar24 * auVar79._4_4_)
                      ;
                      bVar24 = (bool)((byte)(uVar56 >> 2) & 1);
                      fVar95 = (float)((uint)bVar24 * auVar76._8_4_ | (uint)!bVar24 * auVar79._8_4_)
                      ;
                      bVar24 = (bool)((byte)(uVar56 >> 3) & 1);
                      fVar96 = (float)((uint)bVar24 * auVar76._12_4_ |
                                      (uint)!bVar24 * auVar79._12_4_);
                      bVar24 = (bool)((byte)(uVar56 >> 4) & 1);
                      fVar97 = (float)((uint)bVar24 * auVar76._16_4_ |
                                      (uint)!bVar24 * auVar79._16_4_);
                      bVar24 = (bool)((byte)(uVar56 >> 5) & 1);
                      fVar98 = (float)((uint)bVar24 * auVar76._20_4_ |
                                      (uint)!bVar24 * auVar79._20_4_);
                      bVar24 = (bool)((byte)(uVar56 >> 6) & 1);
                      fVar99 = (float)((uint)bVar24 * auVar76._24_4_ |
                                      (uint)!bVar24 * auVar79._24_4_);
                      bVar24 = SUB81(uVar56 >> 7,0);
                      auVar39._4_4_ = fVar108 * fVar94;
                      auVar39._0_4_ = fVar108 * fVar59;
                      auVar39._8_4_ = fVar108 * fVar95;
                      auVar39._12_4_ = fVar108 * fVar96;
                      auVar39._16_4_ = fVar108 * fVar97;
                      auVar39._20_4_ = fVar108 * fVar98;
                      auVar39._24_4_ = fVar108 * fVar99;
                      auVar39._28_4_ = fVar108;
                      auVar63 = vfmadd213ps_fma(auVar135,auVar91,auVar39);
                      auVar63 = vfmadd213ps_fma(auVar129,auVar90,ZEXT1632(auVar63));
                      auVar71 = ZEXT1632(CONCAT412(auVar63._12_4_ + auVar63._12_4_,
                                                   CONCAT48(auVar63._8_4_ + auVar63._8_4_,
                                                            CONCAT44(auVar63._4_4_ + auVar63._4_4_,
                                                                     auVar63._0_4_ + auVar63._0_4_))
                                                  ));
                      auVar136._0_4_ = auVar69._0_4_ * fVar59;
                      auVar136._4_4_ = auVar69._4_4_ * fVar94;
                      auVar136._8_4_ = auVar69._8_4_ * fVar95;
                      auVar136._12_4_ = auVar69._12_4_ * fVar96;
                      auVar136._16_4_ = auVar69._16_4_ * fVar97;
                      auVar136._20_4_ = auVar69._20_4_ * fVar98;
                      auVar136._24_4_ = auVar69._24_4_ * fVar99;
                      auVar136._28_4_ = 0;
                      auVar63 = vfmadd213ps_fma(auVar70,auVar91,auVar136);
                      auVar64 = vfmadd213ps_fma(auVar67,auVar90,ZEXT1632(auVar63));
                      auVar67 = vrcp14ps_avx512vl(auVar71);
                      auVar32._8_4_ = 0x80000000;
                      auVar32._0_8_ = 0x8000000080000000;
                      auVar32._12_4_ = 0x80000000;
                      auVar32._16_4_ = 0x80000000;
                      auVar32._20_4_ = 0x80000000;
                      auVar32._24_4_ = 0x80000000;
                      auVar32._28_4_ = 0x80000000;
                      auVar68 = vxorps_avx512vl(auVar71,auVar32);
                      auVar33._8_4_ = 0x3f800000;
                      auVar33._0_8_ = &DAT_3f8000003f800000;
                      auVar33._12_4_ = 0x3f800000;
                      auVar33._16_4_ = 0x3f800000;
                      auVar33._20_4_ = 0x3f800000;
                      auVar33._24_4_ = 0x3f800000;
                      auVar33._28_4_ = 0x3f800000;
                      auVar69 = vfnmadd213ps_avx512vl(auVar67,auVar71,auVar33);
                      auVar63 = vfmadd132ps_fma(auVar69,auVar67,auVar67);
                      local_2460 = ZEXT1632(CONCAT412(auVar63._12_4_ *
                                                      (auVar64._12_4_ + auVar64._12_4_),
                                                      CONCAT48(auVar63._8_4_ *
                                                               (auVar64._8_4_ + auVar64._8_4_),
                                                               CONCAT44(auVar63._4_4_ *
                                                                        (auVar64._4_4_ +
                                                                        auVar64._4_4_),
                                                                        auVar63._0_4_ *
                                                                        (auVar64._0_4_ +
                                                                        auVar64._0_4_)))));
                      auVar101._4_4_ = fVar111;
                      auVar101._0_4_ = fVar111;
                      auVar101._8_4_ = fVar111;
                      auVar101._12_4_ = fVar111;
                      auVar101._16_4_ = fVar111;
                      auVar101._20_4_ = fVar111;
                      auVar101._24_4_ = fVar111;
                      auVar101._28_4_ = fVar111;
                      uVar115 = vcmpps_avx512vl(local_2460,auVar101,2);
                      uVar100 = *(undefined4 *)
                                 ((long)&(local_2740->super_RayK<1>).org.field_0 + 0xc);
                      auVar34._4_4_ = uVar100;
                      auVar34._0_4_ = uVar100;
                      auVar34._8_4_ = uVar100;
                      auVar34._12_4_ = uVar100;
                      auVar34._16_4_ = uVar100;
                      auVar34._20_4_ = uVar100;
                      auVar34._24_4_ = uVar100;
                      auVar34._28_4_ = uVar100;
                      uVar26 = vcmpps_avx512vl(local_2460,auVar34,0xd);
                      uVar25 = vcmpps_avx512vl(auVar71,auVar68,4);
                      bVar44 = (byte)uVar115 & (byte)uVar26 & (byte)uVar25 & bVar44;
                      if (bVar44 != 0) {
                        local_24c0 = &local_27d9;
                        local_24b8 = CONCAT31(local_24b8._1_3_,bVar44);
                        auVar67 = vsubps_avx(local_24e0,auVar86);
                        auVar67 = vblendps_avx(auVar85,auVar67,0xf0);
                        auVar68 = vsubps_avx(local_24e0,auVar85);
                        auVar68 = vblendps_avx(auVar86,auVar68,0xf0);
                        local_2440[0] = auVar90._0_4_ * 1.0;
                        local_2440[1] = auVar90._4_4_ * 1.0;
                        local_2440[2] = auVar90._8_4_ * 1.0;
                        local_2440[3] = auVar90._12_4_ * 1.0;
                        fStack_2430 = auVar90._16_4_ * -1.0;
                        fStack_242c = auVar90._20_4_ * -1.0;
                        fStack_2428 = auVar90._24_4_ * -1.0;
                        uStack_2424 = auVar90._28_4_;
                        local_2420[0] = auVar91._0_4_ * 1.0;
                        local_2420[1] = auVar91._4_4_ * 1.0;
                        local_2420[2] = auVar91._8_4_ * 1.0;
                        local_2420[3] = auVar91._12_4_ * 1.0;
                        fStack_2410 = auVar91._16_4_ * -1.0;
                        fStack_240c = auVar91._20_4_ * -1.0;
                        fStack_2408 = auVar91._24_4_ * -1.0;
                        uStack_2404 = auVar91._28_4_;
                        local_2400[0] = fVar59 * 1.0;
                        local_2400[1] = fVar94 * 1.0;
                        local_2400[2] = fVar95 * 1.0;
                        local_2400[3] = fVar96 * 1.0;
                        fStack_23f0 = fVar97 * -1.0;
                        fStack_23ec = fVar98 * -1.0;
                        fStack_23e8 = fVar99 * -1.0;
                        uStack_23e4 = (uint)bVar24 * auVar76._28_4_ | (uint)!bVar24 * auVar79._28_4_
                        ;
                        auVar69 = vpbroadcastd_avx512vl();
                        auVar69 = vpaddd_avx2(auVar69,_DAT_0205d4c0);
                        auVar70 = vpbroadcastd_avx512vl();
                        auVar70 = vpaddd_avx2(auVar70,_DAT_0205d4e0);
                        auVar63 = vcvtsi2ss_avx512f(auVar65,*(ushort *)(local_2728 + 8 + local_2730)
                                                            - 1);
                        auVar42._12_4_ = 0;
                        auVar42._0_12_ = ZEXT812(0);
                        auVar64 = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416(auVar63._0_4_));
                        auVar63 = vfnmadd213ss_fma(auVar63,auVar64,SUB6416(ZEXT464(0x40000000),0));
                        fVar111 = auVar64._0_4_ * auVar63._0_4_;
                        auVar63 = vcvtsi2ss_avx512f(auVar65,*(ushort *)
                                                             (local_2728 + 10 + local_2730) - 1);
                        auVar64 = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416(auVar63._0_4_));
                        auVar63 = vfnmadd213ss_fma(auVar63,auVar64,SUB6416(ZEXT464(0x40000000),0));
                        fStack_24e8 = auVar64._0_4_ * auVar63._0_4_;
                        auVar69 = vcvtdq2ps_avx(auVar69);
                        fVar98 = auVar69._28_4_ + auVar67._28_4_;
                        fVar108 = (local_24e0._0_4_ * auVar69._0_4_ + auVar67._0_4_) * fVar111;
                        fVar59 = (local_24e0._4_4_ * auVar69._4_4_ + auVar67._4_4_) * fVar111;
                        local_2520._4_4_ = fVar59;
                        local_2520._0_4_ = fVar108;
                        fVar94 = (local_24e0._8_4_ * auVar69._8_4_ + auVar67._8_4_) * fVar111;
                        local_2520._8_4_ = fVar94;
                        fVar95 = (local_24e0._12_4_ * auVar69._12_4_ + auVar67._12_4_) * fVar111;
                        local_2520._12_4_ = fVar95;
                        fVar96 = (local_24e0._16_4_ * auVar69._16_4_ + auVar67._16_4_) * fVar111;
                        local_2520._16_4_ = fVar96;
                        fVar97 = (local_24e0._20_4_ * auVar69._20_4_ + auVar67._20_4_) * fVar111;
                        local_2520._20_4_ = fVar97;
                        fVar111 = (local_24e0._24_4_ * auVar69._24_4_ + auVar67._24_4_) * fVar111;
                        local_2520._24_4_ = fVar111;
                        local_2520._28_4_ = fVar98;
                        auVar67 = vcvtdq2ps_avx(auVar70);
                        fStack_24e4 = auVar67._28_4_ + auVar68._28_4_;
                        local_2500 = (local_24e0._0_4_ * auVar67._0_4_ + auVar68._0_4_) *
                                     fStack_24e8;
                        fStack_24fc = (local_24e0._4_4_ * auVar67._4_4_ + auVar68._4_4_) *
                                      fStack_24e8;
                        fStack_24f8 = (local_24e0._8_4_ * auVar67._8_4_ + auVar68._8_4_) *
                                      fStack_24e8;
                        fStack_24f4 = (local_24e0._12_4_ * auVar67._12_4_ + auVar68._12_4_) *
                                      fStack_24e8;
                        fStack_24f0 = (local_24e0._16_4_ * auVar67._16_4_ + auVar68._16_4_) *
                                      fStack_24e8;
                        fStack_24ec = (local_24e0._20_4_ * auVar67._20_4_ + auVar68._20_4_) *
                                      fStack_24e8;
                        fStack_24e8 = (local_24e0._24_4_ * auVar67._24_4_ + auVar68._24_4_) *
                                      fStack_24e8;
                        pGVar19 = (local_2720->geometries).items[uVar47].ptr;
                        if ((pGVar19->mask & (local_2740->super_RayK<1>).mask) != 0) {
                          auVar35._8_4_ = 0x219392ef;
                          auVar35._0_8_ = 0x219392ef219392ef;
                          auVar35._12_4_ = 0x219392ef;
                          auVar35._16_4_ = 0x219392ef;
                          auVar35._20_4_ = 0x219392ef;
                          auVar35._24_4_ = 0x219392ef;
                          auVar35._28_4_ = 0x219392ef;
                          uVar57 = vcmpps_avx512vl(local_24e0,auVar35,5);
                          auVar67 = vrcp14ps_avx512vl(local_24e0);
                          auVar118._8_4_ = 0x3f800000;
                          auVar118._0_8_ = &DAT_3f8000003f800000;
                          auVar118._12_4_ = 0x3f800000;
                          auVar118._16_4_ = 0x3f800000;
                          auVar118._20_4_ = 0x3f800000;
                          auVar118._24_4_ = 0x3f800000;
                          auVar118._28_4_ = 0x3f800000;
                          auVar63 = vfnmadd213ps_fma(local_24e0,auVar67,auVar118);
                          auVar67 = vfmadd132ps_avx512vl(ZEXT1632(auVar63),auVar67,auVar67);
                          fVar1 = (float)((uint)((byte)uVar57 & 1) * auVar67._0_4_);
                          fVar99 = (float)((uint)((byte)(uVar57 >> 1) & 1) * auVar67._4_4_);
                          fVar2 = (float)((uint)((byte)(uVar57 >> 2) & 1) * auVar67._8_4_);
                          fVar3 = (float)((uint)((byte)(uVar57 >> 3) & 1) * auVar67._12_4_);
                          fVar4 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar67._16_4_);
                          fVar5 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar67._20_4_);
                          fVar6 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar67._24_4_);
                          auVar40._4_4_ = fVar59 * fVar99;
                          auVar40._0_4_ = fVar108 * fVar1;
                          auVar40._8_4_ = fVar94 * fVar2;
                          auVar40._12_4_ = fVar95 * fVar3;
                          auVar40._16_4_ = fVar96 * fVar4;
                          auVar40._20_4_ = fVar97 * fVar5;
                          auVar40._24_4_ = fVar111 * fVar6;
                          auVar40._28_4_ = fVar98;
                          local_24a0 = vminps_avx(auVar40,auVar118);
                          auVar41._4_4_ = fStack_24fc * fVar99;
                          auVar41._0_4_ = local_2500 * fVar1;
                          auVar41._8_4_ = fStack_24f8 * fVar2;
                          auVar41._12_4_ = fStack_24f4 * fVar3;
                          auVar41._16_4_ = fStack_24f0 * fVar4;
                          auVar41._20_4_ = fStack_24ec * fVar5;
                          auVar41._24_4_ = fStack_24e8 * fVar6;
                          auVar41._28_4_ = fStack_24e4;
                          local_2480 = vminps_avx(auVar41,auVar118);
                          auVar119 = ZEXT3264(local_2460);
                          auVar102._8_4_ = 0x7f800000;
                          auVar102._0_8_ = 0x7f8000007f800000;
                          auVar102._12_4_ = 0x7f800000;
                          auVar102._16_4_ = 0x7f800000;
                          auVar102._20_4_ = 0x7f800000;
                          auVar102._24_4_ = 0x7f800000;
                          auVar102._28_4_ = 0x7f800000;
                          auVar67 = vblendmps_avx512vl(auVar102,local_2460);
                          auVar92._0_4_ =
                               (uint)(bVar44 & 1) * auVar67._0_4_ |
                               (uint)!(bool)(bVar44 & 1) * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 1) & 1);
                          auVar92._4_4_ = (uint)bVar24 * auVar67._4_4_ | (uint)!bVar24 * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 2) & 1);
                          auVar92._8_4_ = (uint)bVar24 * auVar67._8_4_ | (uint)!bVar24 * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 3) & 1);
                          auVar92._12_4_ =
                               (uint)bVar24 * auVar67._12_4_ | (uint)!bVar24 * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 4) & 1);
                          auVar92._16_4_ =
                               (uint)bVar24 * auVar67._16_4_ | (uint)!bVar24 * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 5) & 1);
                          auVar92._20_4_ =
                               (uint)bVar24 * auVar67._20_4_ | (uint)!bVar24 * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 6) & 1);
                          auVar92._24_4_ =
                               (uint)bVar24 * auVar67._24_4_ | (uint)!bVar24 * 0x7f800000;
                          bVar24 = (bool)((byte)(local_24b8 >> 7) & 1);
                          auVar92._28_4_ =
                               (uint)bVar24 * auVar67._28_4_ | (uint)!bVar24 * 0x7f800000;
                          auVar67 = vshufps_avx(auVar92,auVar92,0xb1);
                          auVar67 = vminps_avx(auVar92,auVar67);
                          auVar68 = vshufpd_avx(auVar67,auVar67,5);
                          auVar67 = vminps_avx(auVar67,auVar68);
                          auVar68 = vpermpd_avx2(auVar67,0x4e);
                          auVar67 = vminps_avx(auVar67,auVar68);
                          uVar115 = vcmpps_avx512vl(auVar92,auVar67,0);
                          bVar44 = (byte)uVar115 & bVar44;
                          uVar50 = (uint)bVar44;
                          if (bVar44 == 0) {
                            uVar50 = local_24b8;
                          }
                          uVar57 = 0;
                          for (uVar49 = (ulong)(uVar50 & 0xff); (uVar49 & 1) == 0;
                              uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                            uVar57 = uVar57 + 1;
                          }
                          pRVar54 = local_2738->args;
                          if ((pRVar54->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            fVar111 = *(float *)(local_24a0 + uVar57 * 4);
                            fVar108 = *(float *)(local_2480 + uVar57 * 4);
                            fVar59 = local_2440[uVar57];
                            fVar94 = local_2420[uVar57];
                            fVar95 = local_2400[uVar57];
                            (local_2740->super_RayK<1>).tfar = local_2440[uVar57 - 8];
                            (local_2740->Ng).field_0.field_0.x = fVar59;
                            (local_2740->Ng).field_0.field_0.y = fVar94;
                            (local_2740->Ng).field_0.field_0.z = fVar95;
                            local_2740->u = fVar111;
                            local_2740->v = fVar108;
                            local_2740->primID = uVar18;
                            local_2740->geomID = uVar58;
                            pRVar23 = local_2738->user;
                            local_2740->instID[0] = pRVar23->instID[0];
                            local_2740->instPrimID[0] = pRVar23->instPrimID[0];
                          }
                          else {
                            local_27c0 = local_2738->user;
                            local_2600 = local_2460;
                            uVar58 = local_24b8;
                            local_27d0 = pRVar54;
                            local_27b0 = uVar47;
                            do {
                              auVar63 = auVar146._0_16_;
                              local_26a4 = *(undefined4 *)(local_24a0 + uVar57 * 4);
                              local_26a0 = *(undefined4 *)(local_2480 + uVar57 * 4);
                              local_27b8 = CONCAT44(local_27b8._4_4_,(pRVar43->super_RayK<1>).tfar);
                              (pRVar43->super_RayK<1>).tfar = local_2440[uVar57 - 8];
                              local_26b0 = local_2440[uVar57];
                              local_26ac = local_2420[uVar57];
                              local_26a8 = local_2400[uVar57];
                              local_269c = (int)local_2790;
                              local_2698 = (int)uVar47;
                              local_2694 = local_27c0->instID[0];
                              local_2690 = local_27c0->instPrimID[0];
                              local_279c = -1;
                              local_2710.valid = &local_279c;
                              local_2710.geometryUserPtr = pGVar19->userPtr;
                              local_2710.context = local_27c0;
                              local_2710.ray = (RTCRayN *)pRVar43;
                              local_2710.hit = (RTCHitN *)&local_26b0;
                              local_2710.N = 1;
                              if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fdb6e5:
                                auVar63 = auVar146._0_16_;
                                if (pRVar54->filter != (RTCFilterFunctionN)0x0) {
                                  if (((pRVar54->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                       != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                     (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                                    (*pRVar54->filter)(&local_2710);
                                    auVar119 = ZEXT3264(local_2600);
                                    auVar150 = ZEXT3264(local_2680);
                                    auVar149 = ZEXT3264(local_2660);
                                    auVar148 = ZEXT3264(local_2640);
                                    auVar147 = ZEXT3264(local_2620);
                                    auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                    auVar146 = ZEXT1664(auVar63);
                                    uVar47 = local_27b0;
                                    pRVar54 = local_27d0;
                                  }
                                  if (*local_2710.valid == 0) goto LAB_01fdb7a9;
                                }
                                (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.x =
                                     *(float *)local_2710.hit;
                                (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_2710.hit + 4);
                                (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_2710.hit + 8);
                                *(float *)((long)local_2710.ray + 0x3c) =
                                     *(float *)(local_2710.hit + 0xc);
                                *(float *)((long)local_2710.ray + 0x40) =
                                     *(float *)(local_2710.hit + 0x10);
                                *(float *)((long)local_2710.ray + 0x44) =
                                     *(float *)(local_2710.hit + 0x14);
                                *(float *)((long)local_2710.ray + 0x48) =
                                     *(float *)(local_2710.hit + 0x18);
                                *(float *)((long)local_2710.ray + 0x4c) =
                                     *(float *)(local_2710.hit + 0x1c);
                                *(float *)((long)local_2710.ray + 0x50) =
                                     *(float *)(local_2710.hit + 0x20);
                              }
                              else {
                                (*pGVar19->intersectionFilterN)(&local_2710);
                                auVar119 = ZEXT3264(local_2600);
                                auVar150 = ZEXT3264(local_2680);
                                auVar149 = ZEXT3264(local_2660);
                                auVar148 = ZEXT3264(local_2640);
                                auVar147 = ZEXT3264(local_2620);
                                auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                auVar146 = ZEXT1664(auVar63);
                                uVar47 = local_27b0;
                                pRVar54 = local_27d0;
                                if (*local_2710.valid != 0) goto LAB_01fdb6e5;
LAB_01fdb7a9:
                                (pRVar43->super_RayK<1>).tfar = (float)local_27b8;
                              }
                              bVar27 = ~(byte)(1 << ((uint)uVar57 & 0x1f)) & (byte)uVar58;
                              fVar111 = (pRVar43->super_RayK<1>).tfar;
                              auVar36._4_4_ = fVar111;
                              auVar36._0_4_ = fVar111;
                              auVar36._8_4_ = fVar111;
                              auVar36._12_4_ = fVar111;
                              auVar36._16_4_ = fVar111;
                              auVar36._20_4_ = fVar111;
                              auVar36._24_4_ = fVar111;
                              auVar36._28_4_ = fVar111;
                              uVar115 = vcmpps_avx512vl(auVar119._0_32_,auVar36,2);
                              bVar44 = bVar27 & (byte)uVar115;
                              uVar58 = (uint)bVar44;
                              if ((bVar27 & (byte)uVar115) != 0) {
                                auVar103._8_4_ = 0x7f800000;
                                auVar103._0_8_ = 0x7f8000007f800000;
                                auVar103._12_4_ = 0x7f800000;
                                auVar103._16_4_ = 0x7f800000;
                                auVar103._20_4_ = 0x7f800000;
                                auVar103._24_4_ = 0x7f800000;
                                auVar103._28_4_ = 0x7f800000;
                                auVar67 = vblendmps_avx512vl(auVar103,auVar119._0_32_);
                                auVar93._0_4_ =
                                     (uint)(bVar44 & 1) * auVar67._0_4_ |
                                     (uint)!(bool)(bVar44 & 1) * 0x7f800000;
                                bVar24 = (bool)(bVar44 >> 1 & 1);
                                auVar93._4_4_ =
                                     (uint)bVar24 * auVar67._4_4_ | (uint)!bVar24 * 0x7f800000;
                                bVar24 = (bool)(bVar44 >> 2 & 1);
                                auVar93._8_4_ =
                                     (uint)bVar24 * auVar67._8_4_ | (uint)!bVar24 * 0x7f800000;
                                bVar24 = (bool)(bVar44 >> 3 & 1);
                                auVar93._12_4_ =
                                     (uint)bVar24 * auVar67._12_4_ | (uint)!bVar24 * 0x7f800000;
                                bVar24 = (bool)(bVar44 >> 4 & 1);
                                auVar93._16_4_ =
                                     (uint)bVar24 * auVar67._16_4_ | (uint)!bVar24 * 0x7f800000;
                                bVar24 = (bool)(bVar44 >> 5 & 1);
                                auVar93._20_4_ =
                                     (uint)bVar24 * auVar67._20_4_ | (uint)!bVar24 * 0x7f800000;
                                bVar24 = (bool)(bVar44 >> 6 & 1);
                                auVar93._24_4_ =
                                     (uint)bVar24 * auVar67._24_4_ | (uint)!bVar24 * 0x7f800000;
                                auVar93._28_4_ =
                                     (uint)(bVar44 >> 7) * auVar67._28_4_ |
                                     (uint)!(bool)(bVar44 >> 7) * 0x7f800000;
                                auVar67 = vshufps_avx(auVar93,auVar93,0xb1);
                                auVar67 = vminps_avx(auVar93,auVar67);
                                auVar68 = vshufpd_avx(auVar67,auVar67,5);
                                auVar67 = vminps_avx(auVar67,auVar68);
                                auVar68 = vpermpd_avx2(auVar67,0x4e);
                                auVar67 = vminps_avx(auVar67,auVar68);
                                uVar115 = vcmpps_avx512vl(auVar93,auVar67,0);
                                bVar45 = (byte)uVar115 & bVar44;
                                bVar27 = bVar44;
                                if (bVar45 != 0) {
                                  bVar27 = bVar45;
                                }
                                uVar18 = 0;
                                for (uVar50 = (uint)bVar27; (uVar50 & 1) == 0;
                                    uVar50 = uVar50 >> 1 | 0x80000000) {
                                  uVar18 = uVar18 + 1;
                                }
                                uVar57 = (ulong)uVar18;
                              }
                            } while (bVar44 != 0);
                          }
                        }
                      }
                    }
                  }
                  local_2718 = local_2718 - 1 & local_2718;
                } while (local_2718 != 0);
              }
              local_2750 = local_2750 + 1;
            } while (local_2750 != local_2788);
          }
          local_25e0 = (ray->super_RayK<1>).tfar;
          fStack_25dc = local_25e0;
          fStack_25d8 = local_25e0;
          fStack_25d4 = local_25e0;
          fStack_25d0 = local_25e0;
          fStack_25cc = local_25e0;
          fStack_25c8 = local_25e0;
          fStack_25c4 = local_25e0;
          auVar130 = ZEXT3264(_local_2580);
          auVar123 = ZEXT3264(_local_25a0);
          auVar125 = ZEXT3264(_local_25c0);
          auVar119 = ZEXT3264(_local_26e0);
          auVar67 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          auVar132 = ZEXT3264(auVar67);
          auVar137 = ZEXT3264(CONCAT428(0xfffffff8,
                                        CONCAT424(0xfffffff8,
                                                  CONCAT420(0xfffffff8,
                                                            CONCAT416(0xfffffff8,
                                                                      CONCAT412(0xfffffff8,
                                                                                CONCAT48(0xfffffff8,
                                                                                                                                                                                  
                                                  0xfffffff8fffffff8)))))));
          in_ZMM10 = ZEXT3264(local_23e0);
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }